

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImDrawDataBuilder::FlattenIntoSingleLayer(ImDrawDataBuilder *this)

{
  ImVector<ImDrawList_*> *this_00;
  value_type *__dest;
  value_type *__src;
  int i;
  bool bVar1;
  
  i = this->Layers[0].Size;
  this_00 = this->Layers + 1;
  ImVector<ImDrawList_*>::resize(this->Layers,this->Layers[1].Size + i);
  bVar1 = true;
  while ((bVar1 && (this_00->Size != 0))) {
    __dest = ImVector<ImDrawList_*>::operator[](this->Layers,i);
    bVar1 = false;
    __src = ImVector<ImDrawList_*>::operator[](this_00,0);
    memcpy(__dest,__src,(long)this->Layers[1].Size << 3);
    i = i + this->Layers[1].Size;
    ImVector<ImDrawList_*>::resize(this_00,0);
  }
  return;
}

Assistant:

void ImDrawDataBuilder::FlattenIntoSingleLayer()
{
    int n = Layers[0].Size;
    int size = n;
    for (int i = 1; i < IM_ARRAYSIZE(Layers); i++)
        size += Layers[i].Size;
    Layers[0].resize(size);
    for (int layer_n = 1; layer_n < IM_ARRAYSIZE(Layers); layer_n++)
    {
        ImVector<ImDrawList*>& layer = Layers[layer_n];
        if (layer.empty())
            continue;
        memcpy(&Layers[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
        n += layer.Size;
        layer.resize(0);
    }
}